

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::SatdLpTest_Match_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::SatdLpTest_Match_Test> *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<(anonymous_namespace)::SatdTestParam<int_(*)(const_short_*,_int)>_>::SetParam
            ((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x40);
  anon_unknown.dwarf_fe241b::SatdLpTest_Match_Test::SatdLpTest_Match_Test
            ((SatdLpTest_Match_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }